

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall ThreadTrackerItem::ThreadTrackerItem(ThreadTrackerItem *this)

{
  undefined8 *in_RDI;
  allocator_type *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  in_RDI[4] = 0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x105356);
  return;
}

Assistant:

ThreadTrackerItem()
        : numStacks(0),
          aggrStackNameRaw(4096),
          lenName(0)
        {}